

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

UINT8 calculateSum8(UINT8 *buffer,UINT32 bufferSize)

{
  UINT8 local_1d;
  uint local_1c;
  UINT8 counter;
  UINT32 bufferSize_local;
  UINT8 *buffer_local;
  
  if (buffer == (UINT8 *)0x0) {
    buffer_local._7_1_ = '\0';
  }
  else {
    local_1d = '\0';
    local_1c = bufferSize;
    while (local_1c != 0) {
      local_1d = local_1d + buffer[local_1c - 1];
      local_1c = local_1c - 1;
    }
    buffer_local._7_1_ = local_1d;
  }
  return buffer_local._7_1_;
}

Assistant:

UINT8 calculateSum8(const UINT8* buffer, UINT32 bufferSize)
{
    if (!buffer)
        return 0;
    
    UINT8 counter = 0;
    
    while (bufferSize--)
        counter += buffer[bufferSize];
    
    return counter;
}